

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

CBlock * GetBlockChecked(CBlock *__return_storage_ptr__,BlockManager *blockman,
                        CBlockIndex *blockindex)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  allocator<char> local_59;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(__return_storage_ptr__);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock31,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp"
             ,0x25c,false);
  bVar1 = node::BlockManager::IsBlockPruned(blockman,blockindex);
  if (bVar1) {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Block not available (pruned data)",&local_59);
    JSONRPCError(pUVar2,-1,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock31.super_unique_lock);
    bVar1 = node::BlockManager::ReadBlockFromDisk(blockman,__return_storage_ptr__,blockindex);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Block not found on disk",(allocator<char> *)&criticalblock31);
      JSONRPCError(pUVar2,-1,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static CBlock GetBlockChecked(BlockManager& blockman, const CBlockIndex& blockindex)
{
    CBlock block;
    {
        LOCK(cs_main);
        if (blockman.IsBlockPruned(blockindex)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Block not available (pruned data)");
        }
    }

    if (!blockman.ReadBlockFromDisk(block, blockindex)) {
        // Block not found on disk. This could be because we have the block
        // header in our index but not yet have the block or did not accept the
        // block. Or if the block was pruned right after we released the lock above.
        throw JSONRPCError(RPC_MISC_ERROR, "Block not found on disk");
    }

    return block;
}